

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

handle pybind11::detail::tuple_caster<std::tuple,double,double>::
       cast_impl<std::tuple<double,double>,0ul,1ul>(undefined8 *src)

{
  undefined8 uVar1;
  handle hVar2;
  long lVar3;
  array<pybind11::object,_2UL> *__range3;
  array<pybind11::object,_2UL> entries;
  tuple result;
  
  hVar2.m_ptr = (PyObject *)PyFloat_FromDouble(src[1]);
  entries._M_elems[0].super_handle.m_ptr = (handle)(handle)hVar2.m_ptr;
  entries._M_elems[1].super_handle.m_ptr = (handle)PyFloat_FromDouble(*src);
  if (entries._M_elems[1].super_handle.m_ptr == (PyObject *)0x0 || hVar2.m_ptr == (PyObject *)0x0) {
    hVar2.m_ptr = (PyObject *)0x0;
  }
  else {
    tuple::tuple(&result,2);
    for (lVar3 = 0; hVar2.m_ptr = (PyObject *)result.super_object.super_handle.m_ptr, lVar3 != 0x10;
        lVar3 = lVar3 + 8) {
      uVar1 = *(undefined8 *)((long)&entries._M_elems[0].super_handle.m_ptr + lVar3);
      *(undefined8 *)((long)&entries._M_elems[0].super_handle.m_ptr + lVar3) = 0;
      if ((*(byte *)(*(long *)((long)result.super_object.super_handle.m_ptr + 8) + 0xab) & 4) == 0)
      {
        __assert_fail("PyTuple_Check(result.ptr())",
                      "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/pybind11/include/pybind11/cast.h"
                      ,0x588,
                      "static handle pybind11::detail::tuple_caster<std::tuple, double, double>::cast_impl(T &&, return_value_policy, handle, index_sequence<Is...>) [Tuple = std::tuple, Ts = <double, double>, T = std::tuple<double, double>, Is = <0UL, 1UL>]"
                     );
      }
      *(undefined8 *)((long)result.super_object.super_handle.m_ptr + 0x18 + lVar3) = uVar1;
    }
    result.super_object.super_handle.m_ptr = (object)(handle)0x0;
    pybind11::object::~object(&result.super_object);
  }
  std::array<pybind11::object,_2UL>::~array(&entries);
  return (handle)hVar2.m_ptr;
}

Assistant:

static handle cast_impl(T &&src, return_value_policy policy, handle parent, index_sequence<Is...>) {
        std::array<object, size> entries{{
            reinterpret_steal<object>(make_caster<Ts>::cast(std::get<Is>(std::forward<T>(src)), policy, parent))...
        }};
        for (const auto &entry: entries)
            if (!entry)
                return handle();
        tuple result(size);
        int counter = 0;
        for (auto & entry: entries)
            PyTuple_SET_ITEM(result.ptr(), counter++, entry.release().ptr());
        return result.release();
    }